

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzdohrsubstructCondense.cpp
# Opt level: O0

void __thiscall
TPZDohrSubstructCondense<float>::SolveSystemPhi(TPZDohrSubstructCondense<float> *this)

{
  float fVar1;
  int64_t iVar2;
  TPZMatRed<float,_TPZFMatrix<float>_> *newCols;
  float *pfVar3;
  int *piVar4;
  int iVar5;
  TPZFMatrix<float> *in_RDI;
  TPZFMatrix<float> rhs;
  int j;
  int i;
  int ncoarse;
  TPZFMatrix<float> *in_stack_00001f48;
  TPZMatRed<float,_TPZFMatrix<float>_> *in_stack_00001f50;
  float *in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffed8;
  float in_stack_fffffffffffffedc;
  TPZFMatrix<float> *in_stack_fffffffffffffee0;
  float *in_stack_ffffffffffffff08;
  int64_t in_stack_ffffffffffffff10;
  TPZFMatrix<float> *in_stack_ffffffffffffff18;
  TPZMatRed<float,_TPZFMatrix<float>_> *in_stack_ffffffffffffff20;
  float *in_stack_ffffffffffffff30;
  int local_14;
  int local_10;
  
  iVar2 = TPZVec<int>::NElements((TPZVec<int> *)&in_RDI->fElem);
  iVar5 = (int)iVar2;
  TPZFMatrix<float>::TPZFMatrix
            ((TPZFMatrix<float> *)in_stack_ffffffffffffff20,(int64_t)in_stack_ffffffffffffff18,
             in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  for (local_10 = 0; local_10 < iVar5; local_10 = local_10 + 1) {
    in_stack_ffffffffffffff30 =
         TPZFMatrix<float>::operator()
                   (in_stack_fffffffffffffee0,
                    CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),
                    (int64_t)in_stack_fffffffffffffed0);
    *in_stack_ffffffffffffff30 = 1.0;
  }
  newCols = TPZAutoPointer<TPZMatRed<float,_TPZFMatrix<float>_>_>::operator->
                      ((TPZAutoPointer<TPZMatRed<float,_TPZFMatrix<float>_>_> *)
                       &(in_RDI->super_TPZMatrix<float>).super_TPZBaseMatrix.fRow);
  TPZMatRed<float,_TPZFMatrix<float>_>::SetF(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  TPZFMatrix<float>::Resize(in_RDI,(int64_t)in_stack_ffffffffffffff30,(int64_t)newCols);
  TPZAutoPointer<TPZMatRed<float,_TPZFMatrix<float>_>_>::operator->
            ((TPZAutoPointer<TPZMatRed<float,_TPZFMatrix<float>_>_> *)
             &(in_RDI->super_TPZMatrix<float>).super_TPZBaseMatrix.fRow);
  TPZMatRed<float,_TPZFMatrix<float>_>::U1(in_stack_00001f50,in_stack_00001f48);
  TPZAutoPointer<TPZMatRed<float,_TPZFMatrix<float>_>_>::operator->
            ((TPZAutoPointer<TPZMatRed<float,_TPZFMatrix<float>_>_> *)
             &(in_RDI->super_TPZMatrix<float>).super_TPZBaseMatrix.fRow);
  TPZMatRed<float,_TPZFMatrix<float>_>::UGlobal
            ((TPZMatRed<float,_TPZFMatrix<float>_> *)
             rhs.super_TPZMatrix<float>.super_TPZBaseMatrix.fCol,
             (TPZFMatrix<float> *)rhs.super_TPZMatrix<float>.super_TPZBaseMatrix.fRow,
             (TPZFMatrix<float> *)
             rhs.super_TPZMatrix<float>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable);
  for (local_10 = 0; local_10 < iVar5; local_10 = local_10 + 1) {
    pfVar3 = TPZFMatrix<float>::operator()
                       (in_stack_fffffffffffffee0,
                        CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),
                        (int64_t)in_stack_fffffffffffffed0);
    *pfVar3 = *pfVar3 + 10.0;
    for (local_14 = 0; local_14 < iVar5; local_14 = local_14 + 1) {
      pfVar3 = TPZFMatrix<float>::operator()
                         (in_stack_fffffffffffffee0,
                          CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),
                          (int64_t)in_stack_fffffffffffffed0);
      fVar1 = *pfVar3;
      pfVar3 = TPZFMatrix<float>::operator()
                         (in_stack_fffffffffffffee0,
                          CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),
                          (int64_t)in_stack_fffffffffffffed0);
      *pfVar3 = -fVar1;
    }
    pfVar3 = TPZFMatrix<float>::operator()
                       (in_stack_fffffffffffffee0,
                        CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),
                        (int64_t)in_stack_fffffffffffffed0);
    in_stack_fffffffffffffedc = *pfVar3;
    in_stack_fffffffffffffee0 = (TPZFMatrix<float> *)&in_RDI[2].fPivot.super_TPZVec<int>.fStore;
    piVar4 = TPZVec<int>::operator[]((TPZVec<int> *)&in_RDI->fElem,(long)local_10);
    in_stack_fffffffffffffed0 =
         TPZVec<float>::operator[]((TPZVec<float> *)in_stack_fffffffffffffee0,(long)*piVar4);
    *in_stack_fffffffffffffed0 = in_stack_fffffffffffffedc;
  }
  TPZFMatrix<float>::Resize(in_RDI,(int64_t)in_stack_ffffffffffffff30,(int64_t)newCols);
  for (local_10 = 0; local_10 < (int)(in_RDI->super_TPZMatrix<float>).super_TPZBaseMatrix.fCol;
      local_10 = local_10 + 1) {
    for (local_14 = 0; local_14 < iVar5; local_14 = local_14 + 1) {
      pfVar3 = TPZFMatrix<float>::operator()
                         (in_stack_fffffffffffffee0,
                          CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),
                          (int64_t)in_stack_fffffffffffffed0);
      fVar1 = *pfVar3;
      pfVar3 = TPZFMatrix<float>::operator()
                         (in_stack_fffffffffffffee0,
                          CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),
                          (int64_t)in_stack_fffffffffffffed0);
      *pfVar3 = fVar1;
    }
  }
  TPZFMatrix<float>::~TPZFMatrix((TPZFMatrix<float> *)0x1fa6b22);
  return;
}

Assistant:

void TPZDohrSubstructCondense<TVar>::SolveSystemPhi() {
	int ncoarse = fCoarseNodes.NElements();
	int i,j;
	TPZFMatrix<TVar> rhs(this->fNEquations+ncoarse,ncoarse,0.);
	for(i=0; i<ncoarse; i++)
	{
		rhs(fNEquations+i,i) = 1.;
	}
	fMatRedComplete->SetF(rhs);
	fKCi.Resize(ncoarse,ncoarse);
	fMatRedComplete->U1(fKCi);
	fMatRedComplete->UGlobal(fKCi,rhs);
	for(i=0; i<ncoarse; i++) 
	{
		fKCi(i,i) += 10.;
		for(j=0; j<ncoarse; j++)
		{
			fKCi(i,j) = -fKCi(i,j);
		}
		fWeights[fCoarseNodes[i]] = fKCi(i,i);
	}
	fPhiC.Resize(fNEquations,ncoarse);
	for(i=0; i<fNEquations; i++)
	{
		for(j=0; j<ncoarse; j++)
		{
			fPhiC(i,j) = rhs(i,j);
		}
	}
}